

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Loop.H
# Opt level: O0

void amrex::
     LoopConcurrentOnCpu<amrex::MFCellConsLinInterp::interp(amrex::MultiFab_const&,int,amrex::MultiFab&,int,int,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Box_const&,amrex::IntVect_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int)::__1>
               (Box *bx,int ncomp,anon_class_56_7_275f29e7 *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int in_ESI;
  int *in_RDI;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int in_stack_ffffffffffffff90;
  int k_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar7;
  
  uVar7 = 0;
  iVar1 = *in_RDI;
  k_00 = 1;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[2];
  iVar4 = in_RDI[3];
  iVar5 = in_RDI[4];
  iVar6 = in_RDI[5];
  for (local_fc = 0; local_100 = iVar3, local_fc < in_ESI; local_fc = local_fc + 1) {
    for (; local_104 = iVar2, local_100 <= iVar6; local_100 = local_100 + 1) {
      for (; local_108 = iVar1, local_104 <= iVar5; local_104 = local_104 + 1) {
        for (; local_108 <= iVar4; local_108 = local_108 + 1) {
          MFCellConsLinInterp::interp::anon_class_56_7_275f29e7::operator()
                    ((anon_class_56_7_275f29e7 *)CONCAT44(uVar7,in_stack_ffffffffffffffa0),
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI,k_00,in_stack_ffffffffffffff90);
        }
      }
    }
  }
  return;
}

Assistant:

void LoopConcurrentOnCpu (Box const& bx, int ncomp, F&& f) noexcept
{
    const auto lo = amrex::lbound(bx);
    const auto hi = amrex::ubound(bx);
    for (int n = 0; n < ncomp; ++n) {
    for (int k = lo.z; k <= hi.z; ++k) {
    for (int j = lo.y; j <= hi.y; ++j) {
    AMREX_PRAGMA_SIMD
    for (int i = lo.x; i <= hi.x; ++i) {
        f(i,j,k,n);
    }}}}
}